

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O0

void duckdb::TemplatedDecodeSortKey<duckdb::SortKeyConstantOperator<double>>
               (DecodeSortKeyData *decode_data,DecodeSortKeyVectorData *vector_data,Vector *result,
               idx_t result_idx)

{
  bool flip_bytes;
  idx_t iVar1;
  idx_t in_RCX;
  Vector *in_RDX;
  const_data_ptr_t in_RSI;
  long *in_RDI;
  idx_t increment;
  data_t validity_byte;
  idx_t in_stack_ffffffffffffffc8;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffd0;
  
  flip_bytes = *(bool *)(*in_RDI + in_RDI[2]);
  in_RDI[2] = in_RDI[2] + 1;
  if (flip_bytes == (bool)*in_RSI) {
    FlatVector::Validity((Vector *)0x13f5a3c);
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    iVar1 = SortKeyConstantOperator<double>::Decode(in_RSI,in_RDX,in_RCX,flip_bytes);
    in_RDI[2] = iVar1 + in_RDI[2];
  }
  return;
}

Assistant:

void TemplatedDecodeSortKey(DecodeSortKeyData &decode_data, DecodeSortKeyVectorData &vector_data, Vector &result,
                            idx_t result_idx) {
	auto validity_byte = decode_data.data[decode_data.position];
	decode_data.position++;
	if (validity_byte == vector_data.null_byte) {
		// NULL value
		FlatVector::Validity(result).SetInvalid(result_idx);
		return;
	}
	idx_t increment = OP::Decode(decode_data.data + decode_data.position, result, result_idx, vector_data.flip_bytes);
	decode_data.position += increment;
}